

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

HRESULT __thiscall WScriptJsrt::CallbackMessage::CallFunction(CallbackMessage *this,LPCSTR fileName)

{
  JsErrorCode JVar1;
  HRESULT HVar2;
  JsValueRef local_48;
  JsValueRef fname;
  JsValueRef global;
  JsValueRef result;
  JsValueType type;
  
  JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetGlobalObject)(&fname);
  HVar2 = -0x7fffbffb;
  if ((JVar1 == JsNoError) &&
     (JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetValueType)
                        (this->m_function,(JsValueType *)((long)&result + 4)), JVar1 == JsNoError))
  {
    if (result._4_4_ == 3) {
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtConvertValueToString)
                        (this->m_function,&global);
      if (JVar1 != JsNoError) {
        return -0x7fffbffb;
      }
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)("",0,&local_48);
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtRun)
                        (global,0xffffffffffffffff,local_48,
                         JsParseScriptAttributeArrayBufferIsUtf16Encoded,(JsValueRef *)0x0);
    }
    else {
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCallFunction)
                        (this->m_function,&fname,1,&global);
    }
    if (JVar1 == JsNoError) {
      HVar2 = 0;
    }
    else {
      PrintException(fileName,JVar1,(JsValueRef)0x0);
    }
  }
  return HVar2;
}

Assistant:

HRESULT WScriptJsrt::CallbackMessage::CallFunction(LPCSTR fileName)
{
    HRESULT hr = S_OK;

    JsValueRef global;
    JsValueRef result;
    JsValueRef stringValue;
    JsValueType type;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorHR(ChakraRTInterface::JsGetGlobalObject(&global));
    IfJsrtErrorHR(ChakraRTInterface::JsGetValueType(m_function, &type));

    if (type == JsString)
    {
        IfJsrtErrorHR(ChakraRTInterface::JsConvertValueToString(m_function, &stringValue));

        JsValueRef fname;
        ChakraRTInterface::JsCreateString("", strlen(""), &fname);
        // Run the code
        errorCode = ChakraRTInterface::JsRun(stringValue, JS_SOURCE_CONTEXT_NONE,
          fname, JsParseScriptAttributeArrayBufferIsUtf16Encoded,
          nullptr /*no result needed*/);
    }
    else
    {
        errorCode = ChakraRTInterface::JsCallFunction(m_function, &global, 1, &result);
    }

    if (errorCode != JsNoError)
    {
        hr = E_FAIL;
        PrintException(fileName, errorCode);
    }

Error:
    return hr;
}